

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLcode protocol_connect(Curl_easy *data,_Bool *protocol_done)

{
  connectdata *conn_00;
  _Bool _Var1;
  connectdata *conn;
  CURLcode result;
  _Bool *protocol_done_local;
  Curl_easy *data_local;
  
  conn._4_4_ = CURLE_OK;
  conn_00 = data->conn;
  *protocol_done = false;
  _Var1 = Curl_conn_is_connected(conn_00,0);
  if ((_Var1) && (((uint)conn_00->bits >> 0xe & 1) != 0)) {
    if (conn_00->handler->connecting == (_func_CURLcode_Curl_easy_ptr__Bool_ptr *)0x0) {
      *protocol_done = true;
    }
    data_local._4_4_ = CURLE_OK;
  }
  else {
    if (((uint)conn_00->bits >> 0xe & 1) == 0) {
      if (conn_00->handler->connect_it == (_func_CURLcode_Curl_easy_ptr__Bool_ptr *)0x0) {
        *protocol_done = true;
      }
      else {
        conn._4_4_ = (*conn_00->handler->connect_it)(data,protocol_done);
      }
      if (conn._4_4_ == CURLE_OK) {
        conn_00->bits = (ConnectBits)((uint)conn_00->bits & 0xffffbfff | 0x4000);
      }
    }
    data_local._4_4_ = conn._4_4_;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode protocol_connect(struct Curl_easy *data,
                                 bool *protocol_done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  DEBUGASSERT(conn);
  DEBUGASSERT(protocol_done);

  *protocol_done = FALSE;

  if(Curl_conn_is_connected(conn, FIRSTSOCKET)
     && conn->bits.protoconnstart) {
    /* We already are connected, get back. This may happen when the connect
       worked fine in the first call, like when we connect to a local server
       or proxy. Note that we don't know if the protocol is actually done.

       Unless this protocol doesn't have any protocol-connect callback, as
       then we know we're done. */
    if(!conn->handler->connecting)
      *protocol_done = TRUE;

    return CURLE_OK;
  }

  if(!conn->bits.protoconnstart) {
    if(conn->handler->connect_it) {
      /* is there a protocol-specific connect() procedure? */

      /* Call the protocol-specific connect function */
      result = conn->handler->connect_it(data, protocol_done);
    }
    else
      *protocol_done = TRUE;

    /* it has started, possibly even completed but that knowledge isn't stored
       in this bit! */
    if(!result)
      conn->bits.protoconnstart = TRUE;
  }

  return result; /* pass back status */
}